

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_sync_client_lifecycle_functions(t_rs_generator *this,string *client_struct)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  ostream *poVar3;
  string local_40;
  
  poVar1 = &this->f_gen_;
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_40);
  poVar3 = std::operator<<(poVar3,"pub fn new(input_protocol: IP, output_protocol: OP) -> ");
  poVar3 = std::operator<<(poVar3,(string *)client_struct);
  poVar3 = std::operator<<(poVar3,(string *)&SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_40);
  poVar3 = std::operator<<(poVar3,(string *)client_struct);
  poVar3 = std::operator<<(poVar3,
                           " { _i_prot: input_protocol, _o_prot: output_protocol, _sequence_number: 0 }"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_40);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void t_rs_generator::render_sync_client_lifecycle_functions(const string& client_struct) {
  f_gen_
    << indent()
    << "pub fn new(input_protocol: IP, output_protocol: OP) -> "
    << client_struct
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " {"
    << endl;
  indent_up();

  f_gen_
    << indent()
    << client_struct
    << " { _i_prot: input_protocol, _o_prot: output_protocol, _sequence_number: 0 }"
    << endl;

  indent_down();
  f_gen_ << indent() << "}" << endl;
}